

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>
           *this,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  
  context = &this->context_run_mode_;
  iVar1 = decode_run_interruption_error(this,context->_M_elems);
  iVar2 = decode_run_interruption_error(this,context->_M_elems);
  iVar3 = decode_run_interruption_error(this,context->_M_elems);
  iVar4 = -iVar1;
  if (((uint3)ra & 0xff) <= ((uint3)rb & 0xff)) {
    iVar4 = iVar1;
  }
  iVar5 = -iVar2;
  if ((ra._1_2_ & 0xff) <= ((uint3)rb >> 8 & 0xff)) {
    iVar5 = iVar2;
  }
  if ((uint3)rb >> 0x10 < (uint3)ra >> 0x10) {
    iVar3 = -iVar3;
  }
  return (triplet<unsigned_char>)
         (((int3)iVar3 + ((uint3)rb >> 0x10)) * 0x10000 |
          (uint3)((iVar5 + (uint)((uint3)rb >> 8) & 0xff) << 8) | (int3)iVar4 + (int3)rb & 0xffU);
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }